

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall spirv_cross::CompilerGLSL::index_to_swizzle(CompilerGLSL *this,uint32_t index)

{
  uint32_t index_local;
  CompilerGLSL *this_local;
  
  switch(index) {
  case 0:
    this_local = (CompilerGLSL *)0x676561;
    break;
  case 1:
    this_local = (CompilerGLSL *)0x66273b;
    break;
  case 2:
    this_local = (CompilerGLSL *)0x66273e;
    break;
  case 3:
    this_local = (CompilerGLSL *)0x662741;
    break;
  default:
    this_local = (CompilerGLSL *)0x676561;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::index_to_swizzle(uint32_t index)
{
	switch (index)
	{
	case 0:
		return "x";
	case 1:
		return "y";
	case 2:
		return "z";
	case 3:
		return "w";
	default:
		return "x";		// Don't crash, but engage the "undefined behavior" described for out-of-bounds logical addressing in spec.
	}
}